

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yl_opt.c
# Opt level: O0

int yo_opt_update_data_in_format(char *arg,yl_opt *yo)

{
  int iVar1;
  yl_opt *yo_local;
  char *arg_local;
  
  iVar1 = strcasecmp(arg,"xml");
  if (iVar1 == 0) {
    yo->data_in_format = LYD_XML;
  }
  else {
    iVar1 = strcasecmp(arg,"json");
    if (iVar1 == 0) {
      yo->data_in_format = LYD_JSON;
    }
    else {
      iVar1 = strcasecmp(arg,"lyb");
      if (iVar1 != 0) {
        return 1;
      }
      yo->data_in_format = LYD_LYB;
    }
  }
  return 0;
}

Assistant:

int
yo_opt_update_data_in_format(const char *arg, struct yl_opt *yo)
{
    if (!strcasecmp(arg, "xml")) {
        yo->data_in_format = LYD_XML;
    } else if (!strcasecmp(arg, "json")) {
        yo->data_in_format = LYD_JSON;
    } else if (!strcasecmp(arg, "lyb")) {
        yo->data_in_format = LYD_LYB;
    } else {
        return 1;
    }

    return 0;
}